

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

void __thiscall
trieste::detail::Choice<true>::Choice(Choice<true> *this,PatternPtr *first_,PatternPtr *second_)

{
  bool bVar1;
  element_type *this_00;
  runtime_error *this_01;
  PatternPtr *second__local;
  PatternPtr *first__local;
  Choice<true> *this_local;
  
  PatternDef::PatternDef(&this->super_PatternDef);
  (this->super_PatternDef)._vptr_PatternDef = (_func_int **)&PTR__Choice_004902b0;
  CLI::std::shared_ptr<trieste::detail::PatternDef>::shared_ptr(&this->first,first_);
  CLI::std::shared_ptr<trieste::detail::PatternDef>::shared_ptr(&this->second,second_);
  this_00 = CLI::std::
            __shared_ptr_access<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->first);
  bVar1 = PatternDef::has_captures(this_00);
  if (!bVar1) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Static and dynamic view of captures disagree.");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

Choice(PatternPtr first_, PatternPtr second_)
      : first(first_), second(second_)
      {
        if (CapturesLeft != first->has_captures())
          throw std::runtime_error(
            "Static and dynamic view of captures disagree.");
      }